

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NKmerIndex.cc
# Opt level: O0

void __thiscall
NKmerIndex::NKmerIndex
          (NKmerIndex *this,SequenceDistanceGraph *_sg,uint8_t k,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *whitelist)

{
  bool bVar1;
  runtime_error *this_00;
  size_type sVar2;
  long lVar3;
  ulong uVar4;
  reference ppVar5;
  iterator iVar6;
  iterator iVar7;
  size_type sVar8;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  uint64_t kidx;
  pair<bool,_unsigned_long> *kmer;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *__range3
  ;
  int k_i;
  sgNodeID_t n_1;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  contig_kmers;
  vector<kmerPos,_std::allocator<kmerPos>_> local_kmers;
  StringKMerFactory skf;
  sgNodeID_t n;
  uint64_t total_length;
  undefined7 in_stack_fffffffffffffc08;
  uint8_t in_stack_fffffffffffffc0f;
  StringKMerFactory *in_stack_fffffffffffffc10;
  int *in_stack_fffffffffffffc18;
  vector<kmerPos,_std::allocator<kmerPos>_> *in_stack_fffffffffffffc20;
  unsigned_long *in_stack_fffffffffffffc28;
  iterator in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc38;
  BloomFilter *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  __normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>
  in_stack_fffffffffffffc58;
  __normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>
  in_stack_fffffffffffffc60;
  const_iterator in_stack_fffffffffffffc68;
  size_type local_348;
  __normal_iterator<std::pair<bool,_unsigned_long>_*,_std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>_>
  local_2c0;
  kmerPos *local_2b8;
  int local_2ac;
  ulong local_2a8;
  kmerPos local_2a0;
  undefined1 local_288 [584];
  ulong local_40;
  long local_38;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  BloomFilter::BloomFilter
            (in_stack_fffffffffffffc40,(uint64_t)in_stack_fffffffffffffc38,
             (uint32_t)((ulong)in_stack_fffffffffffffc30._M_current >> 0x20));
  std::vector<kmerPos,_std::allocator<kmerPos>_>::vector
            ((vector<kmerPos,_std::allocator<kmerPos>_> *)0x4745c8);
  *(byte *)(in_RDI + 0x40) = local_11;
  *(undefined8 *)(in_RDI + 0x48) = local_10;
  if (local_11 < 0x20) {
    local_38 = 0;
    for (local_40 = 1; uVar4 = local_40,
        sVar2 = std::vector<Node,_std::allocator<Node>_>::size
                          ((vector<Node,_std::allocator<Node>_> *)(*(long *)(in_RDI + 0x48) + 0x40))
        , uVar4 < sVar2; local_40 = local_40 + 1) {
      std::vector<Node,_std::allocator<Node>_>::operator[]
                ((vector<Node,_std::allocator<Node>_> *)(*(long *)(in_RDI + 0x48) + 0x40),local_40);
      lVar3 = std::__cxx11::string::size();
      local_38 = lVar3 + local_38;
    }
    std::vector<kmerPos,_std::allocator<kmerPos>_>::reserve
              ((vector<kmerPos,_std::allocator<kmerPos>_> *)in_stack_fffffffffffffc40,
               (size_type)in_stack_fffffffffffffc38);
    StringKMerFactory::StringKMerFactory(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0f);
    std::vector<kmerPos,_std::allocator<kmerPos>_>::vector
              ((vector<kmerPos,_std::allocator<kmerPos>_> *)0x474753);
    omp_get_num_threads();
    std::vector<kmerPos,_std::allocator<kmerPos>_>::reserve
              ((vector<kmerPos,_std::allocator<kmerPos>_> *)in_stack_fffffffffffffc40,
               (size_type)in_stack_fffffffffffffc38);
    std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
    vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
            *)0x4747a9);
    std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
    reserve((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
             *)in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
    for (local_2a8 = 1; uVar4 = local_2a8,
        sVar2 = std::vector<Node,_std::allocator<Node>_>::size
                          ((vector<Node,_std::allocator<Node>_> *)(*(long *)(in_RDI + 0x48) + 0x40))
        , uVar4 < sVar2; local_2a8 = local_2a8 + 1) {
      std::vector<Node,_std::allocator<Node>_>::operator[]
                ((vector<Node,_std::allocator<Node>_> *)(*(long *)(in_RDI + 0x48) + 0x40),local_2a8)
      ;
      uVar4 = std::__cxx11::string::size();
      if (local_11 <= uVar4) {
        in_stack_fffffffffffffc68._M_current = &local_2a0;
        std::
        vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
        clear((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               *)0x474841);
        std::vector<Node,_std::allocator<Node>_>::operator[]
                  ((vector<Node,_std::allocator<Node>_> *)(*(long *)(in_RDI + 0x48) + 0x40),
                   local_2a8);
        StringKMerFactory::create_kmers
                  ((StringKMerFactory *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                   (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffc30._M_current);
        local_2ac = 0;
        local_2b8 = &local_2a0;
        local_2c0._M_current =
             (pair<bool,_unsigned_long> *)
             std::
             vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
             ::begin((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
        std::
        vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
        end((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
             *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<bool,_unsigned_long>_*,_std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>_>
                                   *)in_stack_fffffffffffffc10,
                                  (__normal_iterator<std::pair<bool,_unsigned_long>_*,_std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)),
              bVar1) {
          ppVar5 = __gnu_cxx::
                   __normal_iterator<std::pair<bool,_unsigned_long>_*,_std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>_>
                   ::operator*(&local_2c0);
          in_stack_fffffffffffffc60._M_current =
               (kmerPos *)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::count((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)in_stack_fffffffffffffc10,
                       (key_type *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
          if (in_stack_fffffffffffffc60._M_current != (kmerPos *)0x0) {
            in_stack_fffffffffffffc58._M_current = (kmerPos *)&ppVar5->second;
            if ((ppVar5->first & 1U) == 0) {
              in_stack_fffffffffffffc54 = -(local_2ac + 1);
            }
            else {
              in_stack_fffffffffffffc54 = local_2ac + 1;
            }
            std::vector<kmerPos,std::allocator<kmerPos>>::
            emplace_back<unsigned_long_const&,long&,int>
                      ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                       in_stack_fffffffffffffc30._M_current,in_stack_fffffffffffffc28,
                       (long *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          }
          local_2ac = local_2ac + 1;
          __gnu_cxx::
          __normal_iterator<std::pair<bool,_unsigned_long>_*,_std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>_>
          ::operator++(&local_2c0);
        }
      }
      sVar2 = std::vector<kmerPos,_std::allocator<kmerPos>_>::size
                        ((vector<kmerPos,_std::allocator<kmerPos>_> *)local_288);
      if (800000000 < sVar2) {
        in_stack_fffffffffffffc40 = (BloomFilter *)(in_RDI + 0x28);
        std::vector<kmerPos,_std::allocator<kmerPos>_>::end
                  ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                   CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
        __gnu_cxx::__normal_iterator<kmerPos_const*,std::vector<kmerPos,std::allocator<kmerPos>>>::
        __normal_iterator<kmerPos*>
                  ((__normal_iterator<const_kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>
                    *)in_stack_fffffffffffffc10,
                   (__normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_> *)
                   CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
        in_stack_fffffffffffffc38 = (string *)local_288;
        std::vector<kmerPos,_std::allocator<kmerPos>_>::begin
                  ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                   CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
        std::vector<kmerPos,_std::allocator<kmerPos>_>::end
                  ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                   CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
        std::vector<kmerPos,std::allocator<kmerPos>>::
        insert<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,void>
                  ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                   CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        std::vector<kmerPos,_std::allocator<kmerPos>_>::clear
                  ((vector<kmerPos,_std::allocator<kmerPos>_> *)0x474aac);
      }
    }
    bVar1 = std::vector<kmerPos,_std::allocator<kmerPos>_>::empty(in_stack_fffffffffffffc20);
    if (!bVar1) {
      in_stack_fffffffffffffc28 = (unsigned_long *)(in_RDI + 0x28);
      std::vector<kmerPos,_std::allocator<kmerPos>_>::end
                ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                 CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      __gnu_cxx::__normal_iterator<kmerPos_const*,std::vector<kmerPos,std::allocator<kmerPos>>>::
      __normal_iterator<kmerPos*>
                ((__normal_iterator<const_kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_>
                  *)in_stack_fffffffffffffc10,
                 (__normal_iterator<kmerPos_*,_std::vector<kmerPos,_std::allocator<kmerPos>_>_> *)
                 CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      in_stack_fffffffffffffc20 = (vector<kmerPos,_std::allocator<kmerPos>_> *)local_288;
      std::vector<kmerPos,_std::allocator<kmerPos>_>::begin
                ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                 CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      std::vector<kmerPos,_std::allocator<kmerPos>_>::end
                ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                 CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      in_stack_fffffffffffffc30 =
           std::vector<kmerPos,std::allocator<kmerPos>>::
           insert<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,void>
                     ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                      CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                      in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58)
      ;
      std::vector<kmerPos,_std::allocator<kmerPos>_>::clear
                ((vector<kmerPos,_std::allocator<kmerPos>_> *)0x474b7e);
    }
    std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
    ~vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
             *)in_stack_fffffffffffffc20);
    std::vector<kmerPos,_std::allocator<kmerPos>_>::~vector(in_stack_fffffffffffffc20);
    StringKMerFactory::~StringKMerFactory((StringKMerFactory *)(local_288 + 0x18));
    iVar6 = std::vector<kmerPos,_std::allocator<kmerPos>_>::begin
                      ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    iVar7 = std::vector<kmerPos,_std::allocator<kmerPos>_>::end
                      ((vector<kmerPos,_std::allocator<kmerPos>_> *)
                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    sdglib::
    sort<__gnu_cxx::__normal_iterator<kmerPos*,std::vector<kmerPos,std::allocator<kmerPos>>>,kmerPos::byKmerContigOffset>
              (iVar6._M_current,iVar7._M_current);
    local_348 = 0;
    while (sVar2 = local_348,
          sVar8 = std::vector<kmerPos,_std::allocator<kmerPos>_>::size
                            ((vector<kmerPos,_std::allocator<kmerPos>_> *)(in_RDI + 0x28)),
          sVar2 < sVar8) {
      std::vector<kmerPos,_std::allocator<kmerPos>_>::operator[]
                ((vector<kmerPos,_std::allocator<kmerPos>_> *)(in_RDI + 0x28),local_348);
      BloomFilter::add((BloomFilter *)in_stack_fffffffffffffc30._M_current,in_stack_fffffffffffffc28
                      );
      local_348 = local_348 + 1;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"You are trying to use K>31, which is not supported by NKmerIndex");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NKmerIndex::NKmerIndex(const SequenceDistanceGraph &_sg, uint8_t k, std::unordered_set<uint64_t> whitelist):
        k(k), bfilter(70*1024*1024), sg(_sg){
    if (k > 31) {
        throw std::runtime_error("You are trying to use K>31, which is not supported by NKmerIndex");
    }
    uint64_t total_length=0;
#pragma omp parallel for reduction(+:total_length)
    for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
        total_length+=sg.nodes[n].sequence.size();
    }
    assembly_kmers.reserve(total_length);
#pragma omp parallel
    {
        StringKMerFactory skf(k);
        std::vector<kmerPos> local_kmers;
        local_kmers.reserve(total_length/(omp_get_num_threads()*4));
        std::vector<std::pair<bool,uint64_t > > contig_kmers;
        contig_kmers.reserve(10000000);
#pragma omp for
        for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
            if (sg.nodes[n].sequence.size() >= k) {
                contig_kmers.clear();
                skf.create_kmers(sg.nodes[n].sequence, contig_kmers);
                int k_i(0);
                for (const auto &kmer:contig_kmers) {
                    if (whitelist.count(kmer.second)) local_kmers.emplace_back(kmer.second, n, kmer.first ? k_i + 1 : -(k_i + 1));

                    k_i++;
                }
            }

            if (local_kmers.size() > 800000000) {
#pragma omp critical(push_kmers)
                {
                    assembly_kmers.insert(assembly_kmers.end(), local_kmers.begin(), local_kmers.end());
                }
                local_kmers.clear();
            }
        }
        if (!local_kmers.empty()) {
#pragma omp critical(push_kmers)
            {
                assembly_kmers.insert(assembly_kmers.end(), local_kmers.begin(), local_kmers.end());
            }
            local_kmers.clear();
        }
    }
    sdglib::sort(assembly_kmers.begin(),assembly_kmers.end(), kmerPos::byKmerContigOffset());

#pragma omp parallel for
    for (uint64_t kidx = 0; kidx < assembly_kmers.size(); ++kidx) {
        bfilter.add(assembly_kmers[kidx].kmer);
    }
}